

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tictactoe.cpp
# Opt level: O0

bool __thiscall Game::IsLineOwned(Game *this,Line line)

{
  value_type vVar1;
  iterator pvVar2;
  reference pvVar3;
  const_reference pvVar4;
  bool local_51;
  value_type middleCellOwner;
  value_type index;
  iterator __end1;
  iterator __begin1;
  Line *__range1;
  Game *this_local;
  
  __end1 = std::array<unsigned_long,_3UL>::begin(&line);
  pvVar2 = std::array<unsigned_long,_3UL>::end(&line);
  while( true ) {
    if (__end1 == pvVar2) {
      pvVar3 = std::array<unsigned_long,_3UL>::operator[](&line,1);
      pvVar4 = std::array<Player,_9UL>::operator[](&this->m_board,*pvVar3);
      vVar1 = *pvVar4;
      if (vVar1 == None) {
        this_local._7_1_ = false;
      }
      else {
        pvVar3 = std::array<unsigned_long,_3UL>::operator[](&line,0);
        pvVar4 = std::array<Player,_9UL>::operator[](&this->m_board,*pvVar3);
        local_51 = false;
        if (vVar1 == *pvVar4) {
          pvVar3 = std::array<unsigned_long,_3UL>::operator[](&line,2);
          pvVar4 = std::array<Player,_9UL>::operator[](&this->m_board,*pvVar3);
          local_51 = vVar1 == *pvVar4;
        }
        this_local._7_1_ = local_51;
      }
      return this_local._7_1_;
    }
    if (8 < *__end1) break;
    __end1 = __end1 + 1;
  }
  __assert_fail("index < 9",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AntoineJT[P]cpp-things/tictactoe.cpp"
                ,0x3f,"bool Game::IsLineOwned(Line) const");
}

Assistant:

bool IsLineOwned(Line line) const noexcept {
            #ifndef NDEBUG
            for (auto index : line) {
                assert(index < 9);
            }
            #endif

            const auto middleCellOwner = m_board[line[1]];
            if (middleCellOwner == Player::None) {
                return false;
            }

            return middleCellOwner == m_board[line[0]]
                && middleCellOwner == m_board[line[2]];
        }